

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

bool __thiscall
slang::DiagnosticEngine::issueImpl
          (DiagnosticEngine *this,Diagnostic *diagnostic,DiagnosticSeverity severity)

{
  SourceLocation location;
  SourceLocation loc_00;
  span<const_slang::SourceRange,_18446744073709551615UL> ranges;
  bool bVar1;
  uint uVar2;
  DiagnosticSeverity DVar3;
  SourceLocation SVar4;
  BufferID *args;
  size_type sVar5;
  element_type *peVar6;
  reference pDVar7;
  long in_RSI;
  undefined8 *in_RDI;
  Diagnostic *note;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *__range1_1;
  shared_ptr<slang::DiagnosticClient> *client;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
  *__range1;
  ReportedDiagnostic report;
  string message;
  SourceLocation originalLoc;
  anon_class_8_1_8991fb9c checkSuppressed;
  SourceLocation prevLoc;
  bool showIncludeStack;
  size_t ignoreExpansionsUntil;
  SourceLocation loc;
  SmallVector<slang::SourceLocation,_8UL> expansionLocs;
  locator loc_1;
  size_t pos0;
  size_t hash;
  BufferID *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  undefined6 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 in_stack_fffffffffffffbaf;
  SourceLocation in_stack_fffffffffffffbb0;
  SmallVector<slang::SourceLocation,_8UL> *in_stack_fffffffffffffbb8;
  span<const_slang::SourceRange,_18446744073709551615UL> *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  size_type sVar8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  SourceLocation in_stack_fffffffffffffbe0;
  SourceLocation in_stack_fffffffffffffbe8;
  SourceManager *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  SourceManager *in_stack_fffffffffffffc00;
  undefined8 *puVar9;
  SourceLocation in_stack_fffffffffffffc08;
  undefined8 *hash_00;
  undefined4 in_stack_fffffffffffffc68;
  DiagCode in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  DiagCode in_stack_fffffffffffffc74;
  __normal_iterator<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
  local_378;
  long local_370;
  reference local_368;
  shared_ptr<slang::DiagnosticClient> *local_360;
  __normal_iterator<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
  local_358;
  undefined8 *local_350;
  __sv_type local_348;
  undefined1 in_stack_fffffffffffffce8 [16];
  Diagnostic *diag;
  DiagnosticEngine *in_stack_fffffffffffffcf8;
  DiagnosticEngine *in_stack_fffffffffffffd00;
  pointer in_stack_fffffffffffffd08;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd10;
  SourceLocation in_stack_fffffffffffffd18;
  uint32_t local_254;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_250;
  SourceLocation local_228;
  SourceLocation local_220;
  SourceLocation local_218;
  SourceLocation local_210;
  SourceLocation local_208;
  SourceLocation local_200;
  SourceLocation local_1f8;
  SourceLocation local_1f0;
  SourceLocation local_1e8;
  SourceLocation local_1e0;
  byte local_1c1;
  size_type local_1c0;
  SourceLocation local_1b8;
  SmallVectorBase<slang::SourceLocation> local_1b0 [3];
  long local_150;
  byte local_139;
  uint32_t *local_138;
  undefined8 *local_130;
  uint32_t *local_128;
  undefined8 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::BufferID>
  local_a0;
  size_t local_88;
  BufferID *local_80;
  SourceLocation local_78;
  uint32_t *local_70;
  undefined8 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  BufferID *local_20;
  size_t local_18;
  SourceLocation local_10;
  undefined8 *local_8;
  
  local_150 = in_RSI;
  SmallVector<slang::SourceLocation,_8UL>::SmallVector
            ((SmallVector<slang::SourceLocation,_8UL> *)0x634e4b);
  local_1b8 = *(SourceLocation *)(local_150 + 0x60);
  local_1c0 = 0;
  local_1c1 = 0;
  bVar1 = SourceLocation::operator==(&local_1b8,(SourceLocation *)&SourceLocation::NoLocation);
  diag = in_stack_fffffffffffffce8._8_8_;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    while( true ) {
      local_1e0 = local_1b8;
      bVar1 = SourceManager::isMacroLoc
                        ((SourceManager *)
                         CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                         in_stack_fffffffffffffbe0);
      if (!bVar1) break;
      local_1e8 = local_1b8;
      local_1f0 = local_1b8;
      bVar1 = SourceManager::isMacroArgLoc
                        ((SourceManager *)
                         CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                         in_stack_fffffffffffffbe0);
      if (bVar1) {
        local_200 = local_1b8;
        local_1f8 = SourceManager::getExpansionLoc
                              (in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
        SmallVectorBase<slang::SourceLocation>::push_back
                  ((SmallVectorBase<slang::SourceLocation> *)in_stack_fffffffffffffbb0,
                   (SourceLocation *)
                   CONCAT17(in_stack_fffffffffffffbaf,
                            CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
        local_210 = local_1b8;
        local_208 = SourceManager::getOriginalLoc
                              ((SourceManager *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8)
        ;
        local_1b8 = local_208;
      }
      else {
        SmallVectorBase<slang::SourceLocation>::push_back
                  ((SmallVectorBase<slang::SourceLocation> *)in_stack_fffffffffffffbb0,
                   (SourceLocation *)
                   CONCAT17(in_stack_fffffffffffffbaf,
                            CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
        local_220 = local_1b8;
        local_218 = SourceManager::getExpansionLoc
                              (in_stack_fffffffffffffc00,in_stack_fffffffffffffc08);
        local_1b8 = local_218;
      }
      local_228 = local_1e8;
      std::span<const_slang::SourceRange,_18446744073709551615UL>::
      span<const_std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>_&>
                (in_stack_fffffffffffffbc0,
                 (vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)
                 in_stack_fffffffffffffbb8);
      ranges._M_extent._M_extent_value = in_stack_fffffffffffffd10._M_extent_value;
      ranges._M_ptr = in_stack_fffffffffffffd08;
      bVar1 = checkMacroArgRanges(in_stack_fffffffffffffd00,in_stack_fffffffffffffd18,ranges);
      if (bVar1) {
        local_1c0 = SmallVectorBase<slang::SourceLocation>::size(local_1b0);
      }
    }
    puVar9 = in_RDI + 0x10;
    local_254 = (uint32_t)SourceLocation::buffer((SourceLocation *)in_stack_fffffffffffffbb8);
    local_138 = &local_254;
    local_130 = puVar9;
    local_128 = local_138;
    local_120 = puVar9;
    local_70 = local_138;
    local_68 = puVar9;
    SVar4 = (SourceLocation)
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
            ::key_from<slang::BufferID>((BufferID *)0x635198);
    local_78 = SVar4;
    args = (BufferID *)
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
           ::hash_for<slang::BufferID>
                     ((table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                       *)in_stack_fffffffffffffbb0,
                      (BufferID *)
                      CONCAT17(in_stack_fffffffffffffbaf,
                               CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
    local_80 = args;
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                               *)in_stack_fffffffffffffbb0,
                              CONCAT17(in_stack_fffffffffffffbaf,
                                       CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)
                                      ));
    local_10 = local_78;
    local_20 = local_80;
    hash_00 = puVar9;
    local_18 = local_88;
    local_8 = puVar9;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<slang::BufferID,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::BufferID>_>
                 ::groups((table_arrays<slang::BufferID,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::BufferID>_>
                           *)0x635276);
      local_40 = local_40 + local_38;
      uVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                      in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
      local_44 = uVar2;
      if (uVar2 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<slang::BufferID,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::BufferID>_>
                   ::elements((table_arrays<slang::BufferID,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::BufferID>_>
                               *)0x6352cb);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)0x63531b);
          in_stack_fffffffffffffbe8 = local_10;
          in_stack_fffffffffffffbf0 =
               (SourceManager *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
               ::key_from<slang::BufferID>((BufferID *)0x635345);
          bVar1 = std::equal_to<slang::BufferID>::operator()
                            ((equal_to<slang::BufferID> *)in_stack_fffffffffffffbb0,
                             (BufferID *)
                             CONCAT17(in_stack_fffffffffffffbaf,
                                      CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8))
                             ,(BufferID *)0x635360);
          diag = in_stack_fffffffffffffce8._8_8_;
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::BufferID>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0063544c;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffbb0,
                                  CONCAT17(in_stack_fffffffffffffbaf,
                                           CONCAT16(in_stack_fffffffffffffbae,
                                                    in_stack_fffffffffffffba8)));
      diag = in_stack_fffffffffffffce8._8_8_;
      if (bVar1) {
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::BufferID>
        ::table_locator(&local_a0);
        goto LAB_0063544c;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,puVar9[1]);
      diag = in_stack_fffffffffffffce8._8_8_;
    } while (bVar1);
    memset(&local_a0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_slang::BufferID>
    ::table_locator(&local_a0);
LAB_0063544c:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                 ::make_iterator((locator *)0x63546e);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_250,&local_b0,&local_b1);
    }
    else if ((ulong)hash_00[5] < (ulong)hash_00[4]) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_at<slang::BufferID>
                ((table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0,
                 (BufferID *)in_stack_fffffffffffffbb8);
      local_c8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                 ::make_iterator((locator *)0x6354f0);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_250,&local_c8,local_e1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_with_rehash<slang::BufferID>
                ((table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)SVar4,(size_t)hash_00,args);
      local_f8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                 ::make_iterator((locator *)0x635558);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_250,&local_f8,local_111);
    }
    local_1c1 = local_250.second & 1;
    DVar3 = getDefaultSeverity(SUB84(in_stack_fffffffffffffbf0,0));
    if (DVar3 == Warning) {
      SVar4._4_4_ = uVar2;
      SVar4._0_4_ = in_stack_fffffffffffffbf8;
      bVar1 = issueImpl::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbf0,
                         (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                          *)in_stack_fffffffffffffbe8,SVar4);
      if (bVar1) {
        local_139 = 0;
        goto LAB_00635ac2;
      }
      sVar8 = local_1c0;
      sVar5 = SmallVectorBase<slang::SourceLocation>::size(local_1b0);
      if ((sVar8 < sVar5) &&
         (bVar1 = std::
                  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ::empty((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           *)in_stack_fffffffffffffbc0), !bVar1)) {
        in_stack_fffffffffffffbb8 = (SmallVector<slang::SourceLocation,_8UL> *)*in_RDI;
        in_stack_fffffffffffffbc0 =
             (span<const_slang::SourceRange,_18446744073709551615UL> *)
             SmallVectorBase<slang::SourceLocation>::operator[](local_1b0,local_1c0);
        location._4_4_ = uVar2;
        location._0_4_ = in_stack_fffffffffffffbf8;
        in_stack_fffffffffffffbb0 =
             SourceManager::getFullyOriginalLoc(in_stack_fffffffffffffbf0,location);
        loc_00._4_4_ = uVar2;
        loc_00._0_4_ = in_stack_fffffffffffffbf8;
        in_stack_fffffffffffffbaf =
             issueImpl::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffbf0,
                        (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                         *)in_stack_fffffffffffffbe8,loc_00);
        if ((bool)in_stack_fffffffffffffbaf) {
          local_139 = 0;
          goto LAB_00635ac2;
        }
      }
    }
  }
  formatMessage_abi_cxx11_(in_stack_fffffffffffffcf8,diag);
  ReportedDiagnostic::ReportedDiagnostic
            ((ReportedDiagnostic *)in_stack_fffffffffffffbb0,
             (Diagnostic *)
             CONCAT17(in_stack_fffffffffffffbaf,
                      CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
  std::span<slang::SourceLocation,_18446744073709551615UL>::
  span<slang::SmallVector<slang::SourceLocation,_8UL>_&>
            ((span<slang::SourceLocation,_18446744073709551615UL> *)in_stack_fffffffffffffbc0,
             in_stack_fffffffffffffbb8);
  std::span<slang::SourceLocation,_18446744073709551615UL>::subspan
            ((span<slang::SourceLocation,_18446744073709551615UL> *)in_stack_fffffffffffffbc0,
             (size_type)in_stack_fffffffffffffbb8,(size_type)in_stack_fffffffffffffbb0);
  std::span<const_slang::SourceLocation,_18446744073709551615UL>::
  span<slang::SourceLocation,_18446744073709551615UL>
            ((span<const_slang::SourceLocation,_18446744073709551615UL> *)in_stack_fffffffffffffbc0,
             (span<slang::SourceLocation,_18446744073709551615UL> *)in_stack_fffffffffffffbb8);
  std::span<const_slang::SourceRange,_18446744073709551615UL>::
  span<const_std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>_&>
            (in_stack_fffffffffffffbc0,
             (vector<slang::SourceRange,_std::allocator<slang::SourceRange>_> *)
             in_stack_fffffffffffffbb8);
  local_348 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbb0);
  local_350 = in_RDI + 0x22;
  local_358._M_current =
       (shared_ptr<slang::DiagnosticClient> *)
       std::
       vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
       ::begin((vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
                *)CONCAT17(in_stack_fffffffffffffbaf,
                           CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
  local_360 = (shared_ptr<slang::DiagnosticClient> *)
              std::
              vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
              ::end((vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
                           ((__normal_iterator<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
                             *)in_stack_fffffffffffffbb0,
                            (__normal_iterator<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbaf,
                                        CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8
                                                ))), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_368 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
                ::operator*(&local_358);
    peVar6 = std::
             __shared_ptr_access<slang::DiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::DiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x63591f);
    (*peVar6->_vptr_DiagnosticClient[2])(peVar6,&stack0xfffffffffffffd08);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<slang::DiagnosticClient>_*,_std::vector<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>_>
    ::operator++(&local_358);
  }
  local_370 = local_150 + 0x30;
  local_378._M_current =
       (Diagnostic *)
       std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::begin
                 ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                  CONCAT17(in_stack_fffffffffffffbaf,
                           CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::end
            ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
             CONCAT17(in_stack_fffffffffffffbaf,
                      CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                           ((__normal_iterator<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                             *)in_stack_fffffffffffffbb0,
                            (__normal_iterator<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbaf,
                                        CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8
                                                ))), ((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
             ::operator*(&local_378);
    in_stack_fffffffffffffbae =
         SourceLocation::operator==(&pDVar7->location,(SourceLocation *)&SourceLocation::NoLocation)
    ;
    if (((in_stack_fffffffffffffbae ^ 0xff) & 1) == 0) {
      in_stack_fffffffffffffc74 = pDVar7->code;
      in_stack_fffffffffffffc70 = 0x80001;
      bVar1 = slang::operator==(in_stack_fffffffffffffc74,(DiagCode)0x80001);
      if (bVar1) goto LAB_00635a75;
      in_stack_fffffffffffffc6c = pDVar7->code;
      in_stack_fffffffffffffc68 = 0xe70006;
      bVar1 = slang::operator==(in_stack_fffffffffffffc6c,(DiagCode)0xe70006);
      if (bVar1) goto LAB_00635a75;
    }
    else {
LAB_00635a75:
      issue((DiagnosticEngine *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
            (Diagnostic *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
    __gnu_cxx::
    __normal_iterator<const_slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
    ::operator++(&local_378);
  }
  local_139 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb0);
LAB_00635ac2:
  SmallVector<slang::SourceLocation,_8UL>::~SmallVector
            ((SmallVector<slang::SourceLocation,_8UL> *)0x635acf);
  return (bool)(local_139 & 1);
}

Assistant:

bool DiagnosticEngine::issueImpl(const Diagnostic& diagnostic, DiagnosticSeverity severity) {
    // Walk out until we find a location for this diagnostic that isn't inside a macro.
    SmallVector<SourceLocation, 8> expansionLocs;
    SourceLocation loc = diagnostic.location;
    size_t ignoreExpansionsUntil = 0;
    bool showIncludeStack = false;

    if (loc != SourceLocation::NoLocation) {
        while (sourceManager.isMacroLoc(loc)) {
            SourceLocation prevLoc = loc;
            if (sourceManager.isMacroArgLoc(loc)) {
                expansionLocs.push_back(sourceManager.getExpansionLoc(loc));
                loc = sourceManager.getOriginalLoc(loc);
            }
            else {
                expansionLocs.push_back(loc);
                loc = sourceManager.getExpansionLoc(loc);
            }

            if (checkMacroArgRanges(*this, prevLoc, diagnostic.ranges))
                ignoreExpansionsUntil = expansionLocs.size();
        }

        showIncludeStack = reportedIncludeStack.emplace(loc.buffer()).second;

        auto checkSuppressed = [&](const std::vector<fs::path>& patterns, SourceLocation loc) {
            if (patterns.empty())
                return false;

            auto& path = sourceManager.getFullPath(loc.buffer());
            for (auto& pattern : patterns) {
                if (svGlobMatches(path, pattern))
                    return true;
            }
            return false;
        };

        if (getDefaultSeverity(diagnostic.code) == DiagnosticSeverity::Warning) {
            if (checkSuppressed(ignoreWarnPatterns, loc))
                return false;

            if (ignoreExpansionsUntil < expansionLocs.size() && !ignoreMacroWarnPatterns.empty()) {
                auto originalLoc = sourceManager.getFullyOriginalLoc(
                    expansionLocs[ignoreExpansionsUntil]);

                if (checkSuppressed(ignoreMacroWarnPatterns, originalLoc))
                    return false;
            }
        }
    }

    std::string message = formatMessage(diagnostic);

    ReportedDiagnostic report(diagnostic);
    report.expansionLocs = std::span<SourceLocation>(expansionLocs).subspan(ignoreExpansionsUntil);
    report.ranges = diagnostic.ranges;
    report.location = loc;
    report.severity = severity;
    report.formattedMessage = message;
    report.shouldShowIncludeStack = showIncludeStack;

    for (auto& client : clients)
        client->report(report);

    // Notes are ignored if location is "NoLocation" since they frequently make no
    // sense without location information.
    for (const Diagnostic& note : diagnostic.notes) {
        // At some point we should figure out how to not hardcode these special cases
        // that allow notes to be issued without a location.
        if (note.location != SourceLocation::NoLocation || note.code == diag::NoteFromHere2 ||
            note.code == diag::NoteUdpCoverage) {
            issue(note);
        }
    }

    return true;
}